

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopySourceCodeInfoTo
          (FileDescriptor *this,FileDescriptorProto *proto)

{
  SourceCodeInfo *from;
  SourceCodeInfo *pSVar1;
  Arena *arena;
  
  from = this->source_code_info_;
  if (from == (SourceCodeInfo *)_SourceCodeInfo_default_instance_ || from == (SourceCodeInfo *)0x0)
  {
    return;
  }
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x10;
  if ((proto->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
    arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pSVar1 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(arena);
    (proto->field_0)._impl_.source_code_info_ = pSVar1;
  }
  SourceCodeInfo::CopyFrom((proto->field_0)._impl_.source_code_info_,from);
  return;
}

Assistant:

void FileDescriptor::CopySourceCodeInfoTo(FileDescriptorProto* proto) const {
  if (source_code_info_ &&
      source_code_info_ != &SourceCodeInfo::default_instance()) {
    *proto->mutable_source_code_info() = *source_code_info_;
  }
}